

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O3

XSAttributeDeclaration * __thiscall
xercesc_4_0::XSObjectFactory::addOrFind
          (XSObjectFactory *this,SchemaAttDef *attDef,XSModel *xsModel,
          XSComplexTypeDefinition *enclosingTypeDef)

{
  PSVIScope PVar1;
  SCOPE scope;
  XSAttributeDeclaration *this_00;
  XSAnnotation *annot;
  XSObjectFactory *this_01;
  XSSimpleTypeDefinition *local_40;
  
  this_00 = (XSAttributeDeclaration *)XSModel::getXSObject(xsModel,attDef);
  if (this_00 == (XSAttributeDeclaration *)0x0) {
    if (attDef->fDatatypeValidator == (DatatypeValidator *)0x0) {
      local_40 = (XSSimpleTypeDefinition *)0x0;
    }
    else {
      local_40 = addOrFind(this,attDef->fDatatypeValidator,xsModel,false);
    }
    PVar1 = attDef->fPSVIScope;
    this_01 = (XSObjectFactory *)0x50;
    this_00 = (XSAttributeDeclaration *)XMemory::operator_new(0x50,this->fMemoryManager);
    annot = getAnnotationFromModel(this_01,xsModel,attDef);
    if (PVar1 != SCP_LOCAL) {
      enclosingTypeDef = (XSComplexTypeDefinition *)0x0;
    }
    scope = (uint)(PVar1 == SCP_LOCAL) * 2;
    if (PVar1 == SCP_GLOBAL) {
      scope = SCOPE_GLOBAL;
      enclosingTypeDef = (XSComplexTypeDefinition *)0x0;
    }
    XSAttributeDeclaration::XSAttributeDeclaration
              (this_00,attDef,local_40,annot,xsModel,scope,enclosingTypeDef,this->fMemoryManager);
    putObjectInMap(this,attDef,(XSObject *)this_00);
  }
  else if (((this_00->fScope == SCOPE_LOCAL) && (enclosingTypeDef != (XSComplexTypeDefinition *)0x0)
           ) && (this_00->fEnclosingCTDefinition == (XSComplexTypeDefinition *)0x0)) {
    this_00->fEnclosingCTDefinition = enclosingTypeDef;
  }
  return this_00;
}

Assistant:

XSAttributeDeclaration*
XSObjectFactory::addOrFind(SchemaAttDef* const attDef,
                           XSModel* const xsModel,
                           XSComplexTypeDefinition* const enclosingTypeDef)
{
    XSAttributeDeclaration* xsObj = (XSAttributeDeclaration*) xsModel->getXSObject(attDef);
    if (xsObj)
    {
        if (xsObj->getScope() == XSConstants::SCOPE_LOCAL
            && xsObj->getEnclosingCTDefinition() == 0
            && enclosingTypeDef)
            xsObj->setEnclosingCTDefinition(enclosingTypeDef);
    }
    else
    {
        XSSimpleTypeDefinition* xsType = 0;
        if (attDef->getDatatypeValidator())
            xsType = addOrFind(attDef->getDatatypeValidator(), xsModel);

        XSConstants::SCOPE scope = XSConstants::SCOPE_ABSENT;
        XSComplexTypeDefinition* enclosingCTDefinition = 0;

        if (attDef->getPSVIScope() == PSVIDefs::SCP_GLOBAL)
            scope = XSConstants::SCOPE_GLOBAL;
        else if (attDef->getPSVIScope() == PSVIDefs::SCP_LOCAL)
        {
            scope = XSConstants::SCOPE_LOCAL;
            enclosingCTDefinition = enclosingTypeDef;
        }

        xsObj = new (fMemoryManager) XSAttributeDeclaration
        (
            attDef
            , xsType
            , getAnnotationFromModel(xsModel, attDef)
            , xsModel
            , scope
            , enclosingCTDefinition
            , fMemoryManager
        );
        putObjectInMap(attDef, xsObj);
    }

    return xsObj;
}